

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void * __thiscall
kj::anon_unknown_59::InMemoryFile::mmap
          (InMemoryFile *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  Impl *pIVar1;
  AtomicRefcounted *refcounted;
  undefined8 *puVar2;
  undefined4 in_register_0000000c;
  _func_int **pp_Var3;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint64_t offset_local;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault f;
  
  pp_Var3 = (_func_int **)CONCAT44(in_register_0000000c,__prot);
  lock.ptr = (Impl *)&offset_local;
  lock.mutex = (Mutex *)((long)pp_Var3 + __len);
  offset_local = __len;
  if (__len <= lock.mutex) {
    lock.ptr = (Impl *)&offset_local;
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&lock,
               (long)__addr + 0x18,__len,lock.mutex,CONCAT44(in_register_00000084,__flags),
               CONCAT44(in_register_0000008c,__fd));
    pIVar1 = lock.ptr;
    Impl::ensureCapacity(lock.ptr,offset_local + (long)pp_Var3);
    puVar2 = (undefined8 *)operator_new(0x18);
    f.exception = (Exception *)((long)__addr + 8);
    LOCK();
    *(int *)((long)__addr + 0x10) = *(int *)((long)__addr + 0x10) + 1;
    UNLOCK();
    *puVar2 = &PTR_disposeImpl_00278f50;
    puVar2[1] = f.exception;
    puVar2[2] = __addr;
    *(int *)((long)__addr + 0x60) = *(int *)((long)__addr + 0x60) + 1;
    Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own
              ((Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)&f);
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)((pIVar1->bytes).ptr + offset_local);
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var3;
    *(undefined8 **)&(this->super_AtomicRefcounted).refcount = puVar2;
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&lock);
    return this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[32]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x32c,FAILED,"offset + size >= offset",
             "_kjCondition,\"mmap() request overflows uint64\"",
             (DebugComparison<unsigned_long,_unsigned_long_&> *)&lock,
             (char (*) [32])"mmap() request overflows uint64");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const override {
    KJ_REQUIRE(offset + size >= offset, "mmap() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(offset + size);

    ArrayDisposer* disposer = new MmapDisposer(atomicAddRef(*this));
    return Array<const byte>(lock->bytes.begin() + offset, size, *disposer);
  }